

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aVaryingInterpolationTests.cpp
# Opt level: O3

bool deqp::gles2::Accuracy::isValidFloat(Precision precision,float val)

{
  Float<unsigned_short,_5,_10,_15,_3U> FVar1;
  bool bVar2;
  bool bVar3;
  Float<unsigned_int,_8,_23,_127,_3U> local_4;
  
  if (precision == PRECISION_MEDIUMP) {
    FVar1 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>(&local_4);
    if ((FVar1.m_value & 0x7fff) == 0x7c00) {
      return false;
    }
    if ((FVar1.m_value & 0x7c00) == 0 && (FVar1.m_value & 0x3ff) != 0) {
      return false;
    }
    bVar2 = (FVar1.m_value & 0x3ff) == 0;
    bVar3 = (FVar1.m_value & 0x7c00) == 0x7c00;
  }
  else {
    if (ABS(val) == INFINITY) {
      return false;
    }
    if (((uint)val & 0x7f800000) == 0 && ((uint)val & 0x7fffff) != 0) {
      return false;
    }
    bVar2 = ((uint)val & 0x7fffff) == 0;
    bVar3 = ((uint)val & 0x7f800000) == 0x7f800000;
  }
  return (bool)(!bVar3 | bVar2);
}

Assistant:

static bool isValidFloat (glu::Precision precision, float val)
{
	if (precision == glu::PRECISION_MEDIUMP)
	{
		tcu::Float16 fp16(val);
		return !fp16.isDenorm() && !fp16.isInf() && !fp16.isNaN();
	}
	else
	{
		tcu::Float32 fp32(val);
		return !fp32.isDenorm() && !fp32.isInf() && !fp32.isNaN();
	}
}